

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalKdevelopGenerator::Generate(cmGlobalKdevelopGenerator *this)

{
  cmGlobalGenerator *pcVar1;
  long lVar2;
  cmGeneratorTarget *this_00;
  size_type sVar3;
  bool bVar4;
  TargetType TVar5;
  char *pcVar6;
  _Base_ptr p_Var7;
  undefined8 *puVar8;
  _Base_ptr p_Var9;
  string executable;
  string fileToOpen;
  string cmakeFilePattern;
  string projectName;
  string outputDir;
  string projectDir;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  p_Var7 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var7 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
    do {
      pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory
                         ((cmLocalGenerator *)**(undefined8 **)(p_Var7 + 2));
      std::__cxx11::string::string((string *)&local_70,pcVar6,(allocator *)&local_50);
      pcVar6 = cmLocalGenerator::GetSourceDirectory
                         ((cmLocalGenerator *)**(undefined8 **)(p_Var7 + 2));
      std::__cxx11::string::string((string *)&local_50,pcVar6,(allocator *)&local_b0);
      cmLocalGenerator::GetProjectName_abi_cxx11_
                (&local_b0,(cmLocalGenerator *)**(undefined8 **)(p_Var7 + 2));
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"CMakeLists.txt;*.cmake;","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      bVar4 = CreateFilelistFile(this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                       *)(p_Var7 + 2),&local_70,&local_50,&local_b0,&local_d0,
                                 &local_f0);
      if (bVar4) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        local_110._M_string_length = 0;
        local_110.field_2._M_local_buf[0] = '\0';
        for (p_Var9 = *(_Base_ptr *)(p_Var7 + 2); p_Var9 != p_Var7[2]._M_parent;
            p_Var9 = (_Base_ptr)&p_Var9->_M_parent) {
          lVar2 = *(long *)p_Var9;
          for (puVar8 = *(undefined8 **)(lVar2 + 0xe8); puVar8 != *(undefined8 **)(lVar2 + 0xf0);
              puVar8 = puVar8 + 1) {
            TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)*puVar8);
            if (TVar5 == EXECUTABLE) {
              this_00 = (cmGeneratorTarget *)*puVar8;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
              pcVar6 = cmGeneratorTarget::GetLocation(this_00,&local_90);
              sVar3 = local_110._M_string_length;
              strlen(pcVar6);
              std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)sVar3,(ulong)pcVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              break;
            }
          }
          if ((char *)local_110._M_string_length != (char *)0x0) break;
        }
        CreateProjectFile(this,&local_70,&local_50,&local_b0,&local_110,&local_d0,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        cmSystemTools::Error("Can not create filelist file",(char *)0x0,(char *)0x0,(char *)0x0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                 local_f0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) {
        return;
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 !=
             &(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->ProjectMap)._M_t.
              _M_impl.super__Rb_tree_header);
  }
  return;
}

Assistant:

void cmGlobalKdevelopGenerator::Generate()
{
  // for each sub project in the project create
  // a kdevelop project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
      it!= this->GlobalGenerator->GetProjectMap().end();
      ++it)
    {
    std::string outputDir=it->second[0]->GetCurrentBinaryDirectory();
    std::string projectDir=it->second[0]->GetSourceDirectory();
    std::string projectName=it->second[0]->GetProjectName();
    std::string cmakeFilePattern("CMakeLists.txt;*.cmake;");
    std::string fileToOpen;
    const std::vector<cmLocalGenerator*>& lgs= it->second;
    // create the project.kdevelop.filelist file
    if(!this->CreateFilelistFile(lgs, outputDir, projectDir,
                                 projectName, cmakeFilePattern, fileToOpen))
      {
      cmSystemTools::Error("Can not create filelist file");
      return;
      }
    //try to find the name of an executable so we have something to
    //run from kdevelop for now just pick the first executable found
    std::string executable;
    for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
         lg!=lgs.end(); lg++)
      {
      std::vector<cmGeneratorTarget*> const& targets =
          (*lg)->GetGeneratorTargets();
      for (std::vector<cmGeneratorTarget*>::const_iterator ti =
           targets.begin(); ti != targets.end(); ti++)
        {
        if ((*ti)->GetType()==cmState::EXECUTABLE)
          {
          executable = (*ti)->GetLocation("");
          break;
          }
        }
      if (!executable.empty())
        {
        break;
        }
      }

    // now create a project file
    this->CreateProjectFile(outputDir, projectDir, projectName,
                            executable, cmakeFilePattern, fileToOpen);
    }
}